

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O3

quicly_cid_encryptor_t *
quicly_new_default_cid_encryptor
          (ptls_cipher_algorithm_t *cid_cipher,ptls_cipher_algorithm_t *reset_token_cipher,
          ptls_hash_algorithm_t *hash,ptls_iovec_t key)

{
  int iVar1;
  quicly_cid_encryptor_t *__ptr;
  ptls_cipher_context_t *ctx;
  ptls_cipher_context_t *ctx_00;
  ptls_cipher_context_t *ppVar2;
  size_t len;
  uint8_t *output;
  ptls_iovec_t secret;
  ptls_iovec_t secret_00;
  uint8_t keybuf [32];
  uint8_t digestbuf [64];
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8_t local_78 [72];
  
  len = key.len;
  if ((cid_cipher->block_size != 8) && (cid_cipher->block_size != 0x10)) {
    __assert_fail("cid_cipher->block_size == 8 || cid_cipher->block_size == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,0xc0,
                  "quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *, ptls_cipher_algorithm_t *, ptls_hash_algorithm_t *, ptls_iovec_t)"
                 );
  }
  if (reset_token_cipher->block_size != 0x10) {
    __assert_fail("reset_token_cipher->block_size == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,0xc1,
                  "quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *, ptls_cipher_algorithm_t *, ptls_hash_algorithm_t *, ptls_iovec_t)"
                 );
  }
  output = key.base;
  if (hash->block_size < len) {
    output = local_78;
    ptls_calc_hash(hash,output,key.base,len);
    len = hash->digest_size;
  }
  __ptr = (quicly_cid_encryptor_t *)malloc(0x30);
  if (__ptr != (quicly_cid_encryptor_t *)0x0) {
    __ptr->encrypt_cid = default_encrypt_cid;
    __ptr->decrypt_cid = default_decrypt_cid;
    __ptr->generate_stateless_reset_token = default_generate_reset_token;
    __ptr[1].encrypt_cid =
         (_func_void_st_quicly_cid_encryptor_t_ptr_quicly_cid_t_ptr_void_ptr_quicly_cid_plaintext_t_ptr
          *)0x0;
    __ptr[1].decrypt_cid =
         (_func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t *)
         0x0;
    __ptr[1].generate_stateless_reset_token =
         (_func_int_st_quicly_cid_encryptor_t_ptr_void_ptr_void_ptr *)0x0;
    local_88 = 0;
    uStack_80 = 0;
    secret.len = len;
    secret.base = output;
    iVar1 = ptls_hkdf_expand_label
                      (hash,local_b8,cid_cipher->key_size,secret,"cid",(ptls_iovec_t)ZEXT816(0),"");
    if (iVar1 == 0) {
      ctx = ptls_cipher_new(cid_cipher,1,local_b8);
      __ptr[1].encrypt_cid =
           (_func_void_st_quicly_cid_encryptor_t_ptr_quicly_cid_t_ptr_void_ptr_quicly_cid_plaintext_t_ptr
            *)ctx;
      if (ctx != (ptls_cipher_context_t *)0x0) {
        ctx_00 = ptls_cipher_new(cid_cipher,0,local_b8);
        __ptr[1].decrypt_cid =
             (_func_size_t_st_quicly_cid_encryptor_t_ptr_quicly_cid_plaintext_t_ptr_void_ptr_size_t
              *)ctx_00;
        if (ctx_00 != (ptls_cipher_context_t *)0x0) {
          local_98 = 0;
          uStack_90 = 0;
          secret_00.len = len;
          secret_00.base = output;
          iVar1 = ptls_hkdf_expand_label
                            (hash,local_b8,reset_token_cipher->key_size,secret_00,"reset",
                             (ptls_iovec_t)ZEXT816(0),"");
          if (iVar1 == 0) {
            ppVar2 = ptls_cipher_new(reset_token_cipher,1,local_b8);
            __ptr[1].generate_stateless_reset_token =
                 (_func_int_st_quicly_cid_encryptor_t_ptr_void_ptr_void_ptr *)ppVar2;
            if (ppVar2 != (ptls_cipher_context_t *)0x0) goto LAB_001169cd;
          }
          ptls_cipher_free(ctx);
          ptls_cipher_free(ctx_00);
          ctx = (ptls_cipher_context_t *)__ptr[1].generate_stateless_reset_token;
          if (ctx == (ptls_cipher_context_t *)0x0) goto LAB_001169c3;
        }
        ptls_cipher_free(ctx);
      }
    }
LAB_001169c3:
    free(__ptr);
  }
  __ptr = (quicly_cid_encryptor_t *)0x0;
LAB_001169cd:
  (*ptls_clear_memory)(local_78,0x40);
  (*ptls_clear_memory)(local_b8,0x20);
  return __ptr;
}

Assistant:

quicly_cid_encryptor_t *quicly_new_default_cid_encryptor(ptls_cipher_algorithm_t *cid_cipher,
                                                         ptls_cipher_algorithm_t *reset_token_cipher, ptls_hash_algorithm_t *hash,
                                                         ptls_iovec_t key)
{
    struct st_quicly_default_encrypt_cid_t *self;
    uint8_t digestbuf[PTLS_MAX_DIGEST_SIZE], keybuf[PTLS_MAX_SECRET_SIZE];

    assert(cid_cipher->block_size == 8 || cid_cipher->block_size == 16);
    assert(reset_token_cipher->block_size == 16);

    if (key.len > hash->block_size) {
        ptls_calc_hash(hash, digestbuf, key.base, key.len);
        key = ptls_iovec_init(digestbuf, hash->digest_size);
    }

    if ((self = malloc(sizeof(*self))) == NULL)
        goto Fail;
    *self = (struct st_quicly_default_encrypt_cid_t){{default_encrypt_cid, default_decrypt_cid, default_generate_reset_token}};

    if (ptls_hkdf_expand_label(hash, keybuf, cid_cipher->key_size, key, "cid", ptls_iovec_init(NULL, 0), "") != 0)
        goto Fail;
    if ((self->cid_encrypt_ctx = ptls_cipher_new(cid_cipher, 1, keybuf)) == NULL)
        goto Fail;
    if ((self->cid_decrypt_ctx = ptls_cipher_new(cid_cipher, 0, keybuf)) == NULL)
        goto Fail;
    if (ptls_hkdf_expand_label(hash, keybuf, reset_token_cipher->key_size, key, "reset", ptls_iovec_init(NULL, 0), "") != 0)
        goto Fail;
    if ((self->reset_token_ctx = ptls_cipher_new(reset_token_cipher, 1, keybuf)) == NULL)
        goto Fail;

    ptls_clear_memory(digestbuf, sizeof(digestbuf));
    ptls_clear_memory(keybuf, sizeof(keybuf));
    return &self->super;

Fail:
    if (self != NULL) {
        if (self->cid_encrypt_ctx != NULL)
            ptls_cipher_free(self->cid_encrypt_ctx);
        if (self->cid_decrypt_ctx != NULL)
            ptls_cipher_free(self->cid_decrypt_ctx);
        if (self->reset_token_ctx != NULL)
            ptls_cipher_free(self->reset_token_ctx);
        free(self);
    }
    ptls_clear_memory(digestbuf, sizeof(digestbuf));
    ptls_clear_memory(keybuf, sizeof(keybuf));
    return NULL;
}